

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O3

void AddSynonymField(Col_Word *wordPtr)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  Cell *pacVar4;
  ulong uVar5;
  
  pacVar4 = AllocCells(1);
  pbVar1 = (byte *)*wordPtr;
  if (pbVar1 != (byte *)0x0) {
    if (((ulong)pbVar1 & 0xf) == 0) {
      if ((*pbVar1 & 2) == 0) goto LAB_0010dab5;
      uVar2 = *pbVar1 & 0xfffffffe;
    }
    else {
      uVar2 = immediateWordTypes[(uint)pbVar1 & 0x1f];
    }
    if (uVar2 == 0xfffffffd) {
      *(char *)((long)pacVar4 + 0) = '\x02';
      *(char *)((long)pacVar4 + 1) = '\0';
      *(char *)((long)pacVar4 + 2) = '\b';
      *(char *)((long)pacVar4 + 3) = '\0';
      *(char *)((long)pacVar4 + 8) = '\0';
      *(char *)((long)pacVar4 + 9) = '\0';
      *(char *)((long)pacVar4 + 10) = '\0';
      *(char *)((long)pacVar4 + 0xb) = '\0';
      *(char *)((long)pacVar4 + 0xc) = '\0';
      *(char *)((long)pacVar4 + 0xd) = '\0';
      *(char *)((long)pacVar4 + 0xe) = '\0';
      *(char *)((long)pacVar4 + 0xf) = '\0';
      uVar5 = *wordPtr & 0xfffffffffffffffc;
      goto LAB_0010daeb;
    }
    if (uVar2 == 0xfffffffe) {
      *(char *)((long)pacVar4 + 0) = '\x02';
      *(char *)((long)pacVar4 + 1) = '\0';
      *(char *)((long)pacVar4 + 2) = '\x04';
      *(char *)((long)pacVar4 + 3) = '\0';
      *(char *)((long)pacVar4 + 8) = '\0';
      *(char *)((long)pacVar4 + 9) = '\0';
      *(char *)((long)pacVar4 + 10) = '\0';
      *(char *)((long)pacVar4 + 0xb) = '\0';
      *(char *)((long)pacVar4 + 0xc) = '\0';
      *(char *)((long)pacVar4 + 0xd) = '\0';
      *(char *)((long)pacVar4 + 0xe) = '\0';
      *(char *)((long)pacVar4 + 0xf) = '\0';
      uVar5 = (long)*wordPtr >> 1;
      goto LAB_0010daeb;
    }
  }
LAB_0010dab5:
  *(char *)((long)pacVar4 + 0) = '\x02';
  *(char *)((long)pacVar4 + 1) = '\0';
  iVar3 = Col_WordType(*wordPtr);
  *(short *)(*pacVar4 + 2) = (short)iVar3;
  *(char *)((long)pacVar4 + 8) = '\0';
  *(char *)((long)pacVar4 + 9) = '\0';
  *(char *)((long)pacVar4 + 10) = '\0';
  *(char *)((long)pacVar4 + 0xb) = '\0';
  *(char *)((long)pacVar4 + 0xc) = '\0';
  *(char *)((long)pacVar4 + 0xd) = '\0';
  *(char *)((long)pacVar4 + 0xe) = '\0';
  *(char *)((long)pacVar4 + 0xf) = '\0';
  uVar5 = *wordPtr;
LAB_0010daeb:
  *(ulong *)(*pacVar4 + 0x10) = uVar5;
  *wordPtr = (Col_Word)pacVar4;
  return;
}

Assistant:

static void
AddSynonymField(
    Col_Word *wordPtr)  /*!< Points to the word to convert. */
{
    Col_Word converted;

    ASSERT(!HasSynonymField(*wordPtr));

    /*!
     * @sideeffect
     * Allocates memory cells.
     */
    converted = (Col_Word) AllocCells(1);
    switch (WORD_TYPE(*wordPtr)) {
    /*
     * Some types have dedicated wrappers.
     */

    case WORD_TYPE_SMALLINT:
        WORD_INTWRAP_INIT(converted, 0, WORD_SMALLINT_VALUE(*wordPtr));
        break;

    case WORD_TYPE_SMALLFP: {
        FloatConvert c;
        WORD_FPWRAP_INIT(converted, 0, WORD_SMALLFP_VALUE(*wordPtr, c));
        break;
    }

    default:
        /*
         * Use generic wrapper.
         */

        WORD_WRAP_INIT(converted, 0, Col_WordType(*wordPtr), *wordPtr);
        break;
    }

    *wordPtr = converted;
}